

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O0

vector<cv::DMatch,_std::allocator<cv::DMatch>_> *
filter_match(vector<cv::DMatch,_std::allocator<cv::DMatch>_> *__return_storage_ptr__,
            vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_model,
            vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test,
            vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
            *matches,double lowe_ratio)

{
  float fVar1;
  bool bVar2;
  reference this;
  const_reference pvVar3;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> *vals;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  *__range1;
  double lowe_ratio_local;
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  *matches_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_model_local;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> *result;
  
  std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::vector(__return_storage_ptr__);
  __end1 = std::
           vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
           ::begin(matches);
  vals = (vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)
         std::
         vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
         ::end(matches);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_*,_std::vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>_>
                                     *)&vals), bVar2) {
    this = __gnu_cxx::
           __normal_iterator<const_std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_*,_std::vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>_>
           ::operator*(&__end1);
    pvVar3 = std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::operator[](this,0);
    fVar1 = *(float *)(pvVar3 + 0xc);
    pvVar3 = std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::operator[](this,1);
    if ((double)fVar1 < lowe_ratio * (double)*(float *)(pvVar3 + 0xc)) {
      pvVar3 = std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::operator[](this,0);
      std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::push_back(__return_storage_ptr__,pvVar3)
      ;
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_*,_std::vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::DMatch> filter_match(const std::vector<cv::KeyPoint>& keypoint_model,
    const std::vector<cv::KeyPoint>& keypoint_test, const std::vector<std::vector<cv::DMatch>>& matches,
    double lowe_ratio)
{
    std::vector<cv::DMatch> result;
    for(const auto& vals : matches)
    {
        if(vals[0].distance < lowe_ratio * vals[1].distance)
        {
            result.push_back(vals[0]);
        }
    }
    return result;
}